

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int yaml_parser_parse_flow_mapping_value(yaml_parser_t *parser,yaml_event_t *event,int empty)

{
  yaml_parser_state_t **top;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  yaml_token_t *pyVar5;
  yaml_char_t *pyVar6;
  yaml_parser_state_t *pyVar7;
  int iVar8;
  
  if (((parser->token_available == 0) && (iVar4 = yaml_parser_fetch_more_tokens(parser), iVar4 == 0)
      ) || (pyVar5 = (parser->tokens).head, pyVar5 == (yaml_token_t *)0x0)) {
    return 0;
  }
  if ((empty == 0) && (pyVar5->type == YAML_VALUE_TOKEN)) {
    iVar8 = 0;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = 0;
    (parser->tokens).head = pyVar5 + 1;
    iVar4 = yaml_parser_fetch_more_tokens(parser);
    if (iVar4 == 0) {
      return 0;
    }
    pyVar5 = (parser->tokens).head;
    if (pyVar5 == (yaml_token_t *)0x0) {
      return 0;
    }
    if ((pyVar5->type | YAML_STREAM_END_TOKEN) != YAML_FLOW_ENTRY_TOKEN) {
      pyVar7 = (parser->states).top;
      if (pyVar7 != (parser->states).end) {
LAB_001076a6:
        (parser->states).top = pyVar7 + 1;
        *pyVar7 = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
        iVar4 = yaml_parser_parse_node(parser,event,0,0);
        return iVar4;
      }
      top = &(parser->states).top;
      iVar4 = yaml_stack_extend(&(parser->states).start,top,&(parser->states).end);
      if (iVar4 != 0) {
        pyVar7 = *top;
        goto LAB_001076a6;
      }
      goto LAB_0010765f;
    }
  }
  parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
  sVar1 = (pyVar5->start_mark).column;
  sVar2 = (pyVar5->start_mark).index;
  sVar3 = (pyVar5->start_mark).line;
  pyVar6 = (yaml_char_t *)yaml_malloc(1);
  if (pyVar6 == (yaml_char_t *)0x0) {
    iVar8 = 0;
  }
  else {
    *pyVar6 = '\0';
    *(undefined8 *)event = 0;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    (event->data).scalar.length = 0;
    *(undefined8 *)((long)&event->data + 0x20) = 0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    *(undefined8 *)((long)&event->data + 0x28) = 0;
    parser = (yaml_parser_t *)&(event->data).scalar.style;
    event->type = YAML_SCALAR_EVENT;
    (event->start_mark).index = sVar2;
    (event->start_mark).line = sVar3;
    (event->start_mark).column = sVar1;
    (event->end_mark).index = sVar2;
    (event->end_mark).line = sVar3;
    (event->end_mark).column = sVar1;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).scalar.value = pyVar6;
    (event->data).scalar.plain_implicit = 1;
    iVar8 = 1;
  }
LAB_0010765f:
  parser->error = YAML_PLAIN_SCALAR_STYLE;
  return iVar8;
}

Assistant:

static int
yaml_parser_parse_flow_mapping_value(yaml_parser_t *parser,
        yaml_event_t *event, int empty)
{
    yaml_token_t *token;

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (empty) {
        parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
        return yaml_parser_process_empty_scalar(parser, event,
                token->start_mark);
    }

    if (token->type == YAML_VALUE_TOKEN) {
        SKIP_TOKEN(parser);
        token = PEEK_TOKEN(parser);
        if (!token) return 0;
        if (token->type != YAML_FLOW_ENTRY_TOKEN
                && token->type != YAML_FLOW_MAPPING_END_TOKEN) {
            if (!PUSH(parser, parser->states,
                        YAML_PARSE_FLOW_MAPPING_KEY_STATE))
                return 0;
            return yaml_parser_parse_node(parser, event, 0, 0);
        }
    }

    parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
    return yaml_parser_process_empty_scalar(parser, event, token->start_mark);
}